

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void ftgkls_(int *A1,char *A2,char *A3,char *A4,int *A5,size_t C2,size_t C3,size_t C4)

{
  fitsfile *fptr;
  void *pvVar1;
  char *pcVar2;
  char *s;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *__ptr;
  char *B3;
  
  B3 = (char *)0x0;
  fptr = gFitsFiles[*A1];
  if ((((C2 < 4) || (*A2 != '\0')) || (A2[1] != '\0')) || ((A2[2] != '\0' || (A2[3] != '\0')))) {
    pvVar1 = memchr(A2,0,C2);
    pcVar2 = A2;
    __ptr = (char *)0x0;
    if (pvVar1 == (void *)0x0) {
      sVar4 = gMinStrLen;
      if (gMinStrLen <= C2) {
        sVar4 = C2;
      }
      pcVar2 = (char *)malloc(sVar4 + 1);
      pcVar2[C2] = '\0';
      memcpy(pcVar2,A2,C2);
      kill_trailing(pcVar2,(char)A2);
      __ptr = pcVar2;
    }
  }
  else {
    __ptr = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C4) {
    sVar4 = C4;
  }
  s = (char *)malloc(sVar4 + 1);
  s[C4] = '\0';
  pcVar5 = A4;
  memcpy(s,A4,C4);
  kill_trailing(s,(char)pcVar5);
  ffgkls(fptr,pcVar2,&B3,s,A5);
  free(__ptr);
  pcVar2 = B3;
  if (B3 != (char *)0x0) {
    sVar3 = strlen(B3);
    if (C3 <= sVar3) {
      sVar3 = C3;
    }
    memcpy(A3,pcVar2,sVar3);
    sVar3 = strlen(pcVar2);
    if (sVar3 <= C3 && C3 - sVar3 != 0) {
      memset(A3 + sVar3,0x20,C3 - sVar3);
    }
    free(pcVar2);
  }
  sVar3 = strlen(s);
  sVar4 = C4;
  if (sVar3 < C4) {
    sVar4 = sVar3;
  }
  memcpy(A4,s,sVar4);
  if (sVar3 <= C4 && C4 - sVar3 != 0) {
    memset(A4 + sVar3,0x20,C4 - sVar3);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTGKLS,ftgkls)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,STRING,PSTRING,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(STRING,2)
   QCF(PSTRING,3)   /*  Defines a character pointer  */
   QCF(PSTRING,4)
   QCF(PINT,5)

   ffgkls( TCF(ftgkls,FITSUNIT,1,0)
           TCF(ftgkls,STRING,2,1)
           , &B3                        /*  Pass address of pointer  */
           TCF(ftgkls,PSTRING,4,1)
           TCF(ftgkls,PINT,5,1)     );

   RCF(FITSUNIT,1)
   RCF(STRING,2)
   RCF(PSTRING,3)      /*  Copies as much of pointer as will fit   */
   RCF(PSTRING,4)      /*     into fortran string and frees space  */
   RCF(PINT,5)
}